

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O3

void brotli::RunLengthCodeZeros
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v_in,
               uint32_t *max_run_length_prefix,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v_out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *extra_bits)

{
  pointer puVar1;
  iterator iVar2;
  ulong uVar3;
  pointer puVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  pointer puVar9;
  ulong uVar10;
  uint32_t run_length_prefix;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint32_t *local_38;
  
  puVar4 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar1 - (long)puVar4 >> 2;
  if (puVar1 != puVar4) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      uVar10 = uVar7 + 1;
      if (uVar7 + 1 < uVar3) {
        uVar10 = uVar3;
      }
      puVar9 = puVar4 + uVar7;
      while (puVar4[uVar7] != 0) {
        uVar7 = uVar7 + 1;
        puVar9 = puVar9 + 1;
        if (uVar10 == uVar7) {
          uVar8 = 0;
          goto LAB_0017777e;
        }
      }
      uVar8 = 0;
      if (uVar7 < uVar3) {
        lVar5 = 0;
        while (*puVar9 == 0) {
          lVar5 = lVar5 + -1;
          puVar9 = puVar9 + 1;
          if (uVar7 - uVar3 == lVar5) {
            uVar8 = (int)uVar3 - (int)uVar7;
LAB_0017777e:
            if (uVar6 < uVar8) {
              uVar6 = uVar8;
            }
            goto LAB_00177785;
          }
        }
        uVar7 = uVar7 - lVar5;
        uVar8 = -(int)lVar5;
      }
      if (uVar6 < uVar8) {
        uVar6 = uVar8;
      }
    } while (uVar7 < uVar3);
LAB_00177785:
    if (uVar6 != 0) {
      local_40 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> local_40 == 0; local_40 = local_40 - 1) {
        }
      }
      goto LAB_00177790;
    }
  }
  local_40 = 0;
LAB_00177790:
  if (*max_run_length_prefix < local_40) {
    local_40 = *max_run_length_prefix;
  }
  *max_run_length_prefix = local_40;
  if (puVar1 != puVar4) {
    uVar7 = 0;
    local_38 = max_run_length_prefix;
    do {
      if (puVar4[uVar7] == 0) {
        uVar10 = uVar7 + 1;
        if (uVar3 <= uVar10) {
          uVar6 = 1;
LAB_0017787f:
LAB_00177888:
          if ((uint)(2 << ((byte)local_40 & 0x1f)) <= uVar6) goto code_r0x00177893;
          local_44 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> local_44 == 0; local_44 = local_44 - 1) {
            }
          }
          iVar2._M_current =
               (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)v_out,iVar2,&local_44);
          }
          else {
            *iVar2._M_current = local_44;
            (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          local_3c = (-1 << ((byte)local_44 & 0x1f)) + uVar6;
          iVar2._M_current =
               (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(extra_bits,iVar2,&local_3c);
          }
          else {
            *iVar2._M_current = local_3c;
            (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          goto LAB_00177849;
        }
        uVar6 = (int)uVar3 - (int)uVar7;
        lVar5 = 1;
        do {
          if (puVar4[uVar7 + lVar5] != 0) {
            uVar6 = (uint)lVar5;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (uVar3 - uVar7 != lVar5);
        uVar10 = uVar7 + uVar6;
        if (uVar6 != 0) goto LAB_0017787f;
      }
      else {
        local_44 = puVar4[uVar7] + *local_38;
        iVar2._M_current =
             (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (v_out,iVar2,&local_44);
        }
        else {
          *iVar2._M_current = local_44;
          (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_44 = 0;
        iVar2._M_current =
             (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (extra_bits,iVar2,&local_44);
        }
        else {
          *iVar2._M_current = 0;
          (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar10 = uVar7 + 1;
      }
LAB_00177849:
      puVar4 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (long)(v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
      uVar7 = uVar10;
    } while (uVar10 < uVar3);
  }
  return;
code_r0x00177893:
  iVar2._M_current =
       (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)v_out,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_44 = ~(-1 << ((byte)local_40 & 0x1f));
  iVar2._M_current =
       (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (extra_bits,iVar2,&local_44);
  }
  else {
    *iVar2._M_current = local_44;
    (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  uVar6 = uVar6 + (-2 << ((byte)local_40 & 0x1f)) + 1;
  if (uVar6 == 0) goto LAB_00177849;
  goto LAB_00177888;
}

Assistant:

void RunLengthCodeZeros(const std::vector<uint32_t>& v_in,
                        uint32_t* max_run_length_prefix,
                        std::vector<uint32_t>* v_out,
                        std::vector<uint32_t>* extra_bits) {
  uint32_t max_reps = 0;
  for (size_t i = 0; i < v_in.size();) {
    for (; i < v_in.size() && v_in[i] != 0; ++i) ;
    uint32_t reps = 0;
    for (; i < v_in.size() && v_in[i] == 0; ++i) {
      ++reps;
    }
    max_reps = std::max(reps, max_reps);
  }
  uint32_t max_prefix = max_reps > 0 ? Log2FloorNonZero(max_reps) : 0;
  max_prefix = std::min(max_prefix, *max_run_length_prefix);
  *max_run_length_prefix = max_prefix;
  for (size_t i = 0; i < v_in.size();) {
    if (v_in[i] != 0) {
      v_out->push_back(v_in[i] + *max_run_length_prefix);
      extra_bits->push_back(0);
      ++i;
    } else {
      uint32_t reps = 1;
      for (size_t k = i + 1; k < v_in.size() && v_in[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      while (reps != 0) {
        if (reps < (2u << max_prefix)) {
          uint32_t run_length_prefix = Log2FloorNonZero(reps);
          v_out->push_back(run_length_prefix);
          extra_bits->push_back(reps - (1u << run_length_prefix));
          break;
        } else {
          v_out->push_back(max_prefix);
          extra_bits->push_back((1u << max_prefix) - 1u);
          reps -= (2u << max_prefix) - 1u;
        }
      }
    }
  }
}